

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio.c
# Opt level: O1

char * lookup_uname_helper(name_cache_conflict *cache,id_t id)

{
  archive *a;
  size_t __size;
  int iVar1;
  char *pcVar2;
  int *piVar3;
  passwd *result;
  passwd pwent;
  passwd *local_68;
  passwd local_60;
  
  if (cache->buff_size == 0) {
    cache->buff_size = 0x100;
    pcVar2 = (char *)malloc(0x100);
    cache->buff = pcVar2;
  }
  if (cache->buff != (char *)0x0) {
    while (local_68 = &local_60,
          iVar1 = getpwuid_r(id,&local_60,cache->buff,cache->buff_size,&local_68), iVar1 == 0x22) {
      __size = cache->buff_size * 2;
      pcVar2 = (char *)realloc(cache->buff,__size);
      if (pcVar2 == (char *)0x0) break;
      cache->buff = pcVar2;
      cache->buff_size = __size;
    }
    if (iVar1 != 0) {
      a = cache->archive;
      piVar3 = __errno_location();
      archive_set_error(a,*piVar3,"Can\'t lookup user for id %d",id);
      return (char *)0x0;
    }
    if (local_68 != (passwd *)0x0) {
      pcVar2 = strdup(local_68->pw_name);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

static int
lookup_uname_helper(struct cpio *cpio, const char **name, id_t id)
{
	struct passwd	*pwent;

	(void)cpio; /* UNUSED */

	errno = 0;
	pwent = getpwuid((uid_t)id);
	if (pwent == NULL) {
		if (errno && errno != ENOENT)
			lafe_warnc(errno, "getpwuid(%s) failed",
			    cpio_i64toa((int64_t)id));
		return 1;
	}

	*name = pwent->pw_name;
	return 0;
}